

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Quantize_x86_avx512::forward
          (Quantize_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int elempack;
  int _w;
  uint _h;
  void *pvVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  int *piVar7;
  undefined1 (*pauVar8) [64];
  byte bVar9;
  int iVar10;
  size_t sVar11;
  int *piVar12;
  int i;
  ulong uVar13;
  int q_1;
  long lVar14;
  undefined1 (*pauVar15) [64];
  ulong uVar16;
  Allocator *pAVar17;
  long lVar18;
  long lVar19;
  int scale_data_size;
  int iVar20;
  int i_1;
  long lVar21;
  int iVar22;
  int q;
  ulong uVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  Mat local_c8;
  ulong local_80;
  int local_74;
  Mat *local_70;
  ulong local_68;
  size_t local_60;
  size_t local_58;
  Mat *local_50;
  Option *local_48;
  Quantize_x86_avx512 *local_40;
  Mat *local_38;
  
  elempack = bottom_blob->elempack;
  iVar22 = bottom_blob->dims;
  _w = bottom_blob->w;
  _h = bottom_blob->h;
  uVar23 = (ulong)_h;
  local_80 = (ulong)(uint)bottom_blob->c;
  local_58 = (size_t)elempack;
  local_50 = bottom_blob;
  local_38 = top_blob;
  if (iVar22 != 3) {
    if (iVar22 != 2) {
      if (iVar22 != 1) {
        return 0;
      }
      sVar11 = 8;
      if (opt->use_packing_layout == false) {
        sVar11 = 1;
      }
      if ((elempack * _w & 7U) != 0) {
        sVar11 = 1;
      }
      Mat::create(top_blob,(elempack * _w) / (int)sVar11,sVar11,(int)sVar11,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        bVar24 = true;
      }
      else {
        bVar24 = (long)top_blob->c * top_blob->cstep == 0;
      }
      if (bVar24) {
        return -100;
      }
      uVar13 = (long)_w / (long)opt->num_threads;
      uVar16 = 1;
      if (1 < (int)uVar13) {
        uVar16 = uVar13 & 0xffffffff;
      }
      iVar20 = (int)uVar16;
      uVar13 = (long)(_w + iVar20 + -1) / (long)iVar20;
      local_74 = iVar22;
      local_48 = opt;
      local_40 = this;
      if (0 < (int)uVar13) {
        local_70 = &(this->super_Quantize).scale_data;
        uVar13 = uVar13 & 0xffffffff;
        local_60 = uVar16 * local_58;
        local_68 = local_60 * 4;
        lVar21 = 0;
        lVar14 = 0;
        iVar22 = _w;
        do {
          iVar10 = iVar22;
          if (iVar20 < iVar22) {
            iVar10 = iVar20;
          }
          iVar22 = -(iVar20 - iVar22);
          quantize((float *)((long)bottom_blob->data + lVar14),
                   (char *)((long)top_blob->data + lVar21),local_70,iVar10 * elempack,1);
          lVar14 = lVar14 + local_68;
          lVar21 = lVar21 + local_60;
          uVar13 = uVar13 - 1;
          top_blob = local_38;
        } while (uVar13 != 0);
      }
      if (bVar24) {
        return -100;
      }
      opt = local_48;
      this = local_40;
      if (local_74 == 3) goto LAB_0047c7ae;
      iVar22 = local_74;
      if (local_74 != 2) {
        return 0;
      }
    }
    bVar9 = (elempack * _h & 7) == 0 & opt->use_packing_layout;
    local_70 = (Mat *)CONCAT71(local_70._1_7_,bVar9);
    local_60 = 1;
    if (bVar9 != 0) {
      local_60 = 8;
    }
    Mat::create(top_blob,_w,(int)(elempack * _h) / (int)local_60,local_60,(int)local_60,
                opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      bVar24 = true;
    }
    else {
      bVar24 = (long)top_blob->c * top_blob->cstep == 0;
    }
    if (bVar24) {
      return -100;
    }
    local_68 = local_68 & 0xffffffffffffff00;
    local_74 = iVar22;
    local_48 = opt;
    if (((0 < (int)_h && elempack == 0x10) & (byte)local_70) == 1) {
      lVar21 = 1;
      auVar26 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
      auVar27 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      lVar14 = 0;
      auVar31 = ZEXT1664(CONCAT115(0x81,CONCAT114(0x81,CONCAT113(0x81,CONCAT112(0x81,CONCAT111(0x81,
                                                  CONCAT110(0x81,CONCAT19(0x81,CONCAT18(0x81,
                                                  0x8181818181818181)))))))));
      uVar13 = 0;
      do {
        pvVar1 = top_blob->data;
        sVar11 = top_blob->elemsize;
        iVar22 = top_blob->w;
        pauVar8 = (undefined1 (*) [64])
                  ((long)bottom_blob->w * uVar13 * bottom_blob->elemsize + (long)bottom_blob->data);
        if ((this->super_Quantize).scale_data_size < 2) {
          pauVar15 = (undefined1 (*) [64])(this->super_Quantize).scale_data.data;
          piVar12 = (this->super_Quantize).scale_data.refcount;
          pAVar17 = (this->super_Quantize).scale_data.allocator;
          iVar20 = (this->super_Quantize).scale_data.w;
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + 1;
            UNLOCK();
          }
        }
        else {
          pauVar15 = (undefined1 (*) [64])
                     ((this->super_Quantize).scale_data.elemsize * uVar13 * 0x10 +
                     (long)(this->super_Quantize).scale_data.data);
          pAVar17 = (this->super_Quantize).scale_data.allocator;
          iVar20 = 0x10;
          piVar12 = (int *)0x0;
        }
        if (iVar20 < 2) {
          auVar30 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar15));
        }
        else {
          auVar30 = *pauVar15;
        }
        if (0 < _w) {
          lVar18 = 0;
          do {
            auVar28 = vmulps_avx512f(auVar30,*pauVar8);
            auVar29 = vmovdqa64_avx512f(auVar26);
            auVar29 = vpternlogd_avx512f(auVar29,auVar28,auVar27,0xf8);
            auVar28 = vaddps_avx512f(auVar28,auVar29);
            auVar28 = vcvttps2dq_avx512f(auVar28);
            auVar25 = vpmovsdb_avx512f(auVar28);
            auVar25 = vpmaxsb_avx(auVar25,auVar31._0_16_);
            *(long *)((long)pvVar1 + lVar18 * 8 + sVar11 * lVar14 * (long)iVar22) = auVar25._0_8_;
            auVar25 = vpshufd_avx(auVar25,0x4e);
            *(long *)((long)pvVar1 + lVar18 * 8 + sVar11 * lVar21 * (long)iVar22) = auVar25._0_8_;
            pauVar8 = pauVar8 + 1;
            lVar18 = lVar18 + 1;
          } while (_w != (int)lVar18);
        }
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            if (pAVar17 == (Allocator *)0x0) {
              free(pauVar15);
              auVar26 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
              auVar27 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
              auVar31 = ZEXT1664(CONCAT115(0x81,CONCAT114(0x81,CONCAT113(0x81,CONCAT112(0x81,
                                                  CONCAT111(0x81,CONCAT110(0x81,CONCAT19(0x81,
                                                  CONCAT18(0x81,0x8181818181818181)))))))));
            }
            else {
              (*pAVar17->_vptr_Allocator[3])();
              auVar26 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
              auVar27 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
              auVar31 = ZEXT1664(CONCAT115(0x81,CONCAT114(0x81,CONCAT113(0x81,CONCAT112(0x81,
                                                  CONCAT111(0x81,CONCAT110(0x81,CONCAT19(0x81,
                                                  CONCAT18(0x81,0x8181818181818181)))))))));
            }
          }
        }
        uVar13 = uVar13 + 1;
        lVar14 = lVar14 + 2;
        lVar21 = lVar21 + 2;
      } while (uVar13 != uVar23);
    }
    if (0 < (int)_h && (elempack == 4 && (byte)local_70 == '\0')) {
      lVar14 = 3;
      uVar13 = 0;
      do {
        iVar22 = local_50->w;
        sVar11 = local_50->elemsize;
        pvVar1 = top_blob->data;
        lVar21 = (long)top_blob->w * top_blob->elemsize;
        pvVar2 = local_50->data;
        if ((this->super_Quantize).scale_data_size < 2) {
          piVar12 = (this->super_Quantize).scale_data.refcount;
          local_c8.data = (this->super_Quantize).scale_data.data;
          piVar7 = (this->super_Quantize).scale_data.refcount;
          local_c8.refcount._0_4_ = SUB84(piVar7,0);
          local_c8.refcount._4_4_ = (undefined4)((ulong)piVar7 >> 0x20);
          sVar3 = (this->super_Quantize).scale_data.elemsize;
          local_c8.elemsize._0_4_ = (undefined4)sVar3;
          local_c8.elemsize._4_4_ = (undefined4)(sVar3 >> 0x20);
          local_c8.elempack = (this->super_Quantize).scale_data.elempack;
          local_c8.allocator = (this->super_Quantize).scale_data.allocator;
          local_c8.dims = (this->super_Quantize).scale_data.dims;
          local_c8.w = (this->super_Quantize).scale_data.w;
          local_c8.h = (this->super_Quantize).scale_data.h;
          local_c8.d = (this->super_Quantize).scale_data.d;
          local_c8.c = (this->super_Quantize).scale_data.c;
          local_c8.cstep = (this->super_Quantize).scale_data.cstep;
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + 1;
            UNLOCK();
          }
        }
        else {
          sVar3 = (this->super_Quantize).scale_data.elemsize;
          local_c8.data =
               (void *)(sVar3 * (lVar14 + -3) + (long)(this->super_Quantize).scale_data.data);
          local_c8.elempack = (this->super_Quantize).scale_data.elempack;
          local_c8.allocator = (this->super_Quantize).scale_data.allocator;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize._0_4_ = (undefined4)sVar3;
          local_c8.elemsize._4_4_ = (undefined4)(sVar3 >> 0x20);
          local_c8.dims = 1;
          local_c8.w = 4;
          local_c8.h = 1;
          local_c8.d = 1;
          local_c8.c = 1;
          local_c8.cstep = 4;
        }
        quantize_pack4to1((float *)((long)iVar22 * uVar13 * sVar11 + (long)pvVar2),
                          (char *)((lVar14 + -3) * lVar21 + (long)pvVar1),
                          (char *)((lVar14 + -2) * lVar21 + (long)pvVar1),
                          (char *)((lVar14 + -1) * lVar21 + (long)pvVar1),
                          (char *)(lVar21 * lVar14 + (long)pvVar1),&local_c8,_w);
        piVar12 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            if (local_c8.allocator == (Allocator *)0x0) {
              if (local_c8.data != (void *)0x0) {
                free(local_c8.data);
              }
            }
            else {
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_c8.cstep = 0;
        local_c8.data = (void *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize._0_4_ = 0;
        local_c8.elemsize._4_4_ = 0;
        local_c8.elempack = 0;
        local_c8.dims = 0;
        local_c8.w = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        uVar13 = uVar13 + 1;
        lVar14 = lVar14 + 4;
      } while (uVar23 != uVar13);
    }
    if (0 < (int)_h && elempack == (int)local_60) {
      lVar14 = 0;
      uVar13 = 0;
      do {
        iVar22 = local_50->w;
        sVar11 = local_50->elemsize;
        pvVar1 = local_50->data;
        iVar20 = top_blob->w;
        sVar3 = top_blob->elemsize;
        pvVar2 = top_blob->data;
        if ((this->super_Quantize).scale_data_size < 2) {
          piVar12 = (this->super_Quantize).scale_data.refcount;
          local_c8.data = (this->super_Quantize).scale_data.data;
          piVar7 = (this->super_Quantize).scale_data.refcount;
          local_c8.refcount._0_4_ = SUB84(piVar7,0);
          local_c8.refcount._4_4_ = (undefined4)((ulong)piVar7 >> 0x20);
          sVar4 = (this->super_Quantize).scale_data.elemsize;
          local_c8.elemsize._0_4_ = (undefined4)sVar4;
          local_c8.elemsize._4_4_ = (undefined4)(sVar4 >> 0x20);
          local_c8.elempack = (this->super_Quantize).scale_data.elempack;
          local_c8.allocator = (this->super_Quantize).scale_data.allocator;
          local_c8.dims = (this->super_Quantize).scale_data.dims;
          local_c8.w = (this->super_Quantize).scale_data.w;
          local_c8.h = (this->super_Quantize).scale_data.h;
          local_c8.d = (this->super_Quantize).scale_data.d;
          local_c8.c = (this->super_Quantize).scale_data.c;
          local_c8.cstep = (this->super_Quantize).scale_data.cstep;
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + 1;
            UNLOCK();
          }
        }
        else {
          sVar4 = (this->super_Quantize).scale_data.elemsize;
          local_c8.data = (void *)(sVar4 * lVar14 + (long)(this->super_Quantize).scale_data.data);
          local_c8.elempack = (this->super_Quantize).scale_data.elempack;
          local_c8.allocator = (this->super_Quantize).scale_data.allocator;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize._0_4_ = (undefined4)sVar4;
          local_c8.elemsize._4_4_ = (undefined4)(sVar4 >> 0x20);
          local_c8.w = elempack;
          local_c8.dims = 1;
          local_c8.h = 1;
          local_c8.d = 1;
          local_c8.c = 1;
          local_c8.cstep = local_58;
        }
        quantize((float *)((long)iVar22 * uVar13 * sVar11 + (long)pvVar1),
                 (char *)((long)iVar20 * uVar13 * sVar3 + (long)pvVar2),&local_c8,_w,elempack);
        piVar12 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            if (local_c8.allocator == (Allocator *)0x0) {
              if (local_c8.data != (void *)0x0) {
                free(local_c8.data);
              }
            }
            else {
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_c8.cstep = 0;
        local_c8.data = (void *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize._0_4_ = 0;
        local_c8.elemsize._4_4_ = 0;
        local_c8.elempack = 0;
        local_c8.dims = 0;
        local_c8.w = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        uVar13 = uVar13 + 1;
        lVar14 = lVar14 + local_58;
      } while (uVar23 != uVar13);
    }
    if ((char)local_68 != '\0') {
      return -100;
    }
    opt = local_48;
    if (local_74 != 3) {
      return 0;
    }
  }
LAB_0047c7ae:
  bVar9 = (elempack * (int)local_80 & 7U) == 0 & opt->use_packing_layout;
  sVar11 = 1;
  if (bVar9 != 0) {
    sVar11 = 8;
  }
  Mat::create(top_blob,_w,_h,(elempack * (int)local_80) / (int)sVar11,sVar11,(int)sVar11,
              opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    bVar24 = true;
  }
  else {
    bVar24 = (long)top_blob->c * top_blob->cstep == 0;
  }
  if (bVar24) {
    return -100;
  }
  local_68 = local_68 & 0xffffffffffffff00;
  local_70 = (Mat *)CONCAT71(local_70._1_7_,bVar9);
  local_60 = sVar11;
  if (((0 < (int)local_80 && elempack == 0x10) & bVar9) == 1) {
    lVar21 = 1;
    auVar26 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
    auVar27 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
    lVar14 = 0;
    auVar31 = ZEXT1664(CONCAT115(0x81,CONCAT114(0x81,CONCAT113(0x81,CONCAT112(0x81,CONCAT111(0x81,
                                                  CONCAT110(0x81,CONCAT19(0x81,CONCAT18(0x81,
                                                  0x8181818181818181)))))))));
    uVar23 = 0;
    do {
      pvVar1 = top_blob->data;
      sVar11 = top_blob->elemsize;
      sVar3 = top_blob->cstep;
      pauVar8 = (undefined1 (*) [64])
                (local_50->cstep * uVar23 * local_50->elemsize + (long)local_50->data);
      if ((this->super_Quantize).scale_data_size < 2) {
        pauVar15 = (undefined1 (*) [64])(this->super_Quantize).scale_data.data;
        piVar12 = (this->super_Quantize).scale_data.refcount;
        pAVar17 = (this->super_Quantize).scale_data.allocator;
        iVar22 = (this->super_Quantize).scale_data.w;
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + 1;
          UNLOCK();
        }
      }
      else {
        pauVar15 = (undefined1 (*) [64])
                   ((this->super_Quantize).scale_data.elemsize * uVar23 * 0x10 +
                   (long)(this->super_Quantize).scale_data.data);
        pAVar17 = (this->super_Quantize).scale_data.allocator;
        iVar22 = 0x10;
        piVar12 = (int *)0x0;
      }
      if (iVar22 < 2) {
        auVar30 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar15));
      }
      else {
        auVar30 = *pauVar15;
      }
      if (0 < (int)(_h * _w)) {
        lVar18 = sVar3 * sVar11;
        lVar19 = 0;
        do {
          auVar28 = vmulps_avx512f(auVar30,*pauVar8);
          auVar29 = vmovdqa64_avx512f(auVar26);
          auVar29 = vpternlogd_avx512f(auVar29,auVar28,auVar27,0xf8);
          auVar28 = vaddps_avx512f(auVar28,auVar29);
          auVar28 = vcvttps2dq_avx512f(auVar28);
          auVar25 = vpmovsdb_avx512f(auVar28);
          auVar25 = vpmaxsb_avx(auVar25,auVar31._0_16_);
          *(long *)((long)pvVar1 + lVar19 * 8 + lVar18 * lVar14) = auVar25._0_8_;
          auVar25 = vpshufd_avx(auVar25,0x4e);
          *(long *)((long)pvVar1 + lVar19 * 8 + lVar18 * lVar21) = auVar25._0_8_;
          pauVar8 = pauVar8 + 1;
          lVar19 = lVar19 + 1;
        } while (_h * _w != (int)lVar19);
      }
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if (pAVar17 == (Allocator *)0x0) {
            free(pauVar15);
            auVar26 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
            auVar27 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
            auVar31 = ZEXT1664(CONCAT115(0x81,CONCAT114(0x81,CONCAT113(0x81,CONCAT112(0x81,CONCAT111
                                                  (0x81,CONCAT110(0x81,CONCAT19(0x81,CONCAT18(0x81,
                                                  0x8181818181818181)))))))));
          }
          else {
            (*pAVar17->_vptr_Allocator[3])();
            auVar26 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
            auVar27 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
            auVar31 = ZEXT1664(CONCAT115(0x81,CONCAT114(0x81,CONCAT113(0x81,CONCAT112(0x81,CONCAT111
                                                  (0x81,CONCAT110(0x81,CONCAT19(0x81,CONCAT18(0x81,
                                                  0x8181818181818181)))))))));
          }
        }
      }
      uVar23 = uVar23 + 1;
      lVar14 = lVar14 + 2;
      lVar21 = lVar21 + 2;
    } while (uVar23 != local_80);
  }
  if (0 < (int)local_80 && (elempack == 4 && (byte)local_70 == '\0')) {
    lVar14 = 3;
    uVar23 = 0;
    do {
      sVar11 = local_50->cstep;
      sVar3 = local_50->elemsize;
      sVar4 = top_blob->cstep;
      pvVar1 = top_blob->data;
      sVar5 = top_blob->elemsize;
      pvVar2 = local_50->data;
      if ((this->super_Quantize).scale_data_size < 2) {
        piVar12 = (this->super_Quantize).scale_data.refcount;
        local_c8.data = (this->super_Quantize).scale_data.data;
        piVar7 = (this->super_Quantize).scale_data.refcount;
        local_c8.refcount._0_4_ = SUB84(piVar7,0);
        local_c8.refcount._4_4_ = (undefined4)((ulong)piVar7 >> 0x20);
        sVar6 = (this->super_Quantize).scale_data.elemsize;
        local_c8.elemsize._0_4_ = (undefined4)sVar6;
        local_c8.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
        local_c8.elempack = (this->super_Quantize).scale_data.elempack;
        local_c8.allocator = (this->super_Quantize).scale_data.allocator;
        local_c8.dims = (this->super_Quantize).scale_data.dims;
        local_c8.w = (this->super_Quantize).scale_data.w;
        local_c8.h = (this->super_Quantize).scale_data.h;
        local_c8.d = (this->super_Quantize).scale_data.d;
        local_c8.c = (this->super_Quantize).scale_data.c;
        local_c8.cstep = (this->super_Quantize).scale_data.cstep;
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + 1;
          UNLOCK();
        }
      }
      else {
        sVar6 = (this->super_Quantize).scale_data.elemsize;
        local_c8.data =
             (void *)(sVar6 * (lVar14 + -3) + (long)(this->super_Quantize).scale_data.data);
        local_c8.elempack = (this->super_Quantize).scale_data.elempack;
        local_c8.allocator = (this->super_Quantize).scale_data.allocator;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize._0_4_ = (undefined4)sVar6;
        local_c8.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
        local_c8.dims = 1;
        local_c8.w = 4;
        local_c8.h = 1;
        local_c8.d = 1;
        local_c8.c = 1;
        local_c8.cstep = 4;
      }
      quantize_pack4to1((float *)(sVar11 * uVar23 * sVar3 + (long)pvVar2),
                        (char *)((lVar14 + -3) * sVar4 * sVar5 + (long)pvVar1),
                        (char *)((lVar14 + -2) * sVar4 * sVar5 + (long)pvVar1),
                        (char *)((lVar14 + -1) * sVar4 * sVar5 + (long)pvVar1),
                        (char *)(sVar4 * lVar14 * sVar5 + (long)pvVar1),&local_c8,_h * _w);
      piVar12 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            if (local_c8.data != (void *)0x0) {
              free(local_c8.data);
            }
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      uVar23 = uVar23 + 1;
      lVar14 = lVar14 + 4;
    } while (local_80 != uVar23);
  }
  if (0 < (int)local_80 && elempack == (int)local_60) {
    lVar14 = 0;
    uVar23 = 0;
    do {
      sVar11 = local_50->cstep;
      sVar3 = local_50->elemsize;
      pvVar1 = local_50->data;
      sVar4 = local_38->cstep;
      sVar5 = local_38->elemsize;
      pvVar2 = local_38->data;
      if ((this->super_Quantize).scale_data_size < 2) {
        piVar12 = (this->super_Quantize).scale_data.refcount;
        local_c8.data = (this->super_Quantize).scale_data.data;
        piVar7 = (this->super_Quantize).scale_data.refcount;
        local_c8.refcount._0_4_ = SUB84(piVar7,0);
        local_c8.refcount._4_4_ = (undefined4)((ulong)piVar7 >> 0x20);
        sVar6 = (this->super_Quantize).scale_data.elemsize;
        local_c8.elemsize._0_4_ = (undefined4)sVar6;
        local_c8.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
        local_c8.elempack = (this->super_Quantize).scale_data.elempack;
        local_c8.allocator = (this->super_Quantize).scale_data.allocator;
        local_c8.dims = (this->super_Quantize).scale_data.dims;
        local_c8.w = (this->super_Quantize).scale_data.w;
        local_c8.h = (this->super_Quantize).scale_data.h;
        local_c8.d = (this->super_Quantize).scale_data.d;
        local_c8.c = (this->super_Quantize).scale_data.c;
        local_c8.cstep = (this->super_Quantize).scale_data.cstep;
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + 1;
          UNLOCK();
        }
      }
      else {
        sVar6 = (this->super_Quantize).scale_data.elemsize;
        local_c8.data = (void *)(sVar6 * lVar14 + (long)(this->super_Quantize).scale_data.data);
        local_c8.elempack = (this->super_Quantize).scale_data.elempack;
        local_c8.allocator = (this->super_Quantize).scale_data.allocator;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize._0_4_ = (undefined4)sVar6;
        local_c8.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
        local_c8.w = elempack;
        local_c8.dims = 1;
        local_c8.h = 1;
        local_c8.d = 1;
        local_c8.c = 1;
        local_c8.cstep = local_58;
      }
      quantize((float *)(sVar11 * uVar23 * sVar3 + (long)pvVar1),
               (char *)(sVar4 * uVar23 * sVar5 + (long)pvVar2),&local_c8,_h * _w,elempack);
      piVar12 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            if (local_c8.data != (void *)0x0) {
              free(local_c8.data);
            }
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      uVar23 = uVar23 + 1;
      lVar14 = lVar14 + local_58;
    } while (local_80 != uVar23);
  }
  if ((char)local_68 == '\0') {
    return 0;
  }
  return -100;
}

Assistant:

int Quantize_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    if (dims == 1)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = w * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outw = w * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int wp = std::max(1, w / opt.num_threads);
        const int nn_w = (w + wp - 1) / wp;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_w; ii++)
        {
            const int i = ii * wp;

            const float* ptr = (const float*)bottom_blob + i * elempack;
            signed char* s8ptr = (signed char*)top_blob + i * elempack;

            // assert scale_data_size == 1

            const int size = std::min(w - i, wp) * elempack;

            quantize(ptr, s8ptr, scale_data, size, 1);
        }
    }

    if (dims == 2)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = h * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outh = h * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr0 = top_blob.row<signed char>(i * 2);
                signed char* s8ptr1 = top_blob.row<signed char>(i * 2 + 1);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize_pack16to8(ptr, s8ptr0, s8ptr1, scale_data_i, w);
            }
        }
#endif // __AVX512F__
#if !__AVX__
        if (elempack == 4 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* ptr0 = bottom_blob.row(i * 2);
                const float* ptr1 = bottom_blob.row(i * 2 + 1);
                signed char* s8ptr = top_blob.row<signed char>(i);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * out_elempack, out_elempack) : scale_data;

                quantize_pack4to8(ptr0, ptr1, s8ptr, scale_data_i, w);
            }
        }
#endif // !__AVX__
        if (elempack == 4 && out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr0 = top_blob.row<signed char>(i * 4);
                signed char* s8ptr1 = top_blob.row<signed char>(i * 4 + 1);
                signed char* s8ptr2 = top_blob.row<signed char>(i * 4 + 2);
                signed char* s8ptr3 = top_blob.row<signed char>(i * 4 + 3);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize_pack4to1(ptr, s8ptr0, s8ptr1, s8ptr2, s8ptr3, scale_data_i, w);
            }
        }
#endif // __SSE2__
        if (elempack == out_elempack)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr = top_blob.row<signed char>(i);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize(ptr, s8ptr, scale_data_i, w, elempack);
            }
        }
    }

    if (dims == 3)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = channels * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outc = channels * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr0 = top_blob.channel(q * 2);
                signed char* s8ptr1 = top_blob.channel(q * 2 + 1);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize_pack16to8(ptr, s8ptr0, s8ptr1, scale_data_q, w * h);
            }
        }
#endif // __AVX512F__
#if !__AVX__
        if (elempack == 4 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const float* ptr0 = bottom_blob.channel(q * 2);
                const float* ptr1 = bottom_blob.channel(q * 2 + 1);
                signed char* s8ptr = top_blob.channel(q);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * out_elempack, out_elempack) : scale_data;

                quantize_pack4to8(ptr0, ptr1, s8ptr, scale_data_q, w * h);
            }
        }
#endif // !__AVX__
        if (elempack == 4 && out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr0 = top_blob.channel(q * 4);
                signed char* s8ptr1 = top_blob.channel(q * 4 + 1);
                signed char* s8ptr2 = top_blob.channel(q * 4 + 2);
                signed char* s8ptr3 = top_blob.channel(q * 4 + 3);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize_pack4to1(ptr, s8ptr0, s8ptr1, s8ptr2, s8ptr3, scale_data_q, w * h);
            }
        }
#endif // __SSE2__
        if (elempack == out_elempack)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr = top_blob.channel(q);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize(ptr, s8ptr, scale_data_q, w * h, elempack);
            }
        }
    }

    return 0;
}